

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O3

void __thiscall
defyx::SuperscalarInstructionInfo::SuperscalarInstructionInfo<2ul>
          (SuperscalarInstructionInfo *this,char *name,SuperscalarInstructionType type,
          MacroOp (*arr) [2],int resultOp,int dstOp,int srcOp)

{
  MacroOp *pMVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  bool bVar7;
  iterator __position;
  MacroOp MStack_48;
  
  this->name_ = name;
  this->type_ = type;
  (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->resultOp_ = resultOp;
  this->dstOp_ = dstOp;
  this->srcOp_ = srcOp;
  __position._M_current = (MacroOp *)0x0;
  lVar6 = 0;
  bVar5 = true;
  do {
    bVar7 = bVar5;
    pMVar1 = *arr + lVar6;
    MStack_48.name_ = pMVar1->name_;
    uVar3._0_4_ = pMVar1->size_;
    uVar3._4_4_ = pMVar1->latency_;
    puVar2 = (undefined8 *)((long)&(*arr)[lVar6].size_ + 1);
    uVar4 = puVar2[1];
    MStack_48.uop1_._0_1_ = (undefined1)((ulong)*puVar2 >> 0x38);
    MStack_48._17_7_ = SUB87(uVar4,0);
    MStack_48.dependent_ = SUB81((ulong)uVar4 >> 0x38,0);
    MStack_48.size_._0_1_ = (undefined1)(undefined4)uVar3;
    MStack_48._9_7_ = SUB87((ulong)uVar3 >> 8,0);
    if (__position._M_current ==
        (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>::
      _M_realloc_insert<defyx::MacroOp>(&this->ops_,__position,&MStack_48);
      __position._M_current =
           (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (__position._M_current)->uop1_ = (int)CONCAT71(MStack_48._17_7_,(undefined1)MStack_48.uop1_);
      (__position._M_current)->uop2_ = MStack_48.uop2_;
      *(ulong *)&(__position._M_current)->dependent_ =
           CONCAT71(MStack_48._25_7_,MStack_48.dependent_);
      (__position._M_current)->name_ = MStack_48.name_;
      (__position._M_current)->size_ = (undefined4)uVar3;
      (__position._M_current)->latency_ = uVar3._4_4_;
      __position._M_current =
           (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current;
    }
    this->latency_ = this->latency_ + __position._M_current[-1].latency_;
    lVar6 = 1;
    bVar5 = false;
  } while (bVar7);
  return;
}

Assistant:

SuperscalarInstructionInfo(const char* name, SuperscalarInstructionType type, const MacroOp(&arr)[N], int resultOp, int dstOp, int srcOp)
			: name_(name), type_(type), latency_(0), resultOp_(resultOp), dstOp_(dstOp), srcOp_(srcOp) {
			for (unsigned i = 0; i < N; ++i) {
				ops_.push_back(MacroOp(arr[i]));
				latency_ += ops_.back().getLatency();
			}
			static_assert(N > 1, "Invalid array size");
		}